

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O1

void __thiscall
DefaultIndexFixture_InsertLeafStore_Test::~DefaultIndexFixture_InsertLeafStore_Test
          (DefaultIndexFixture_InsertLeafStore_Test *this)

{
  (this->super_DefaultIndexFixture).super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__DefaultIndexFixture_002736b0;
  std::
  unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~unique_ptr(&(this->super_DefaultIndexFixture).index_);
  (this->super_DefaultIndexFixture).super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__IndexFixture_00273670;
  pstore::database::~database(&(this->super_DefaultIndexFixture).super_IndexFixture.db_);
  in_memory_store::~in_memory_store(&(this->super_DefaultIndexFixture).super_IndexFixture.store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x160);
  return;
}

Assistant:

TEST_F (DefaultIndexFixture, InsertLeafStore) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    auto const first = std::make_pair ("a"s, "b"s);
    index_->insert_or_assign (t1, first);
    index_->flush (t1, db_.get_current_revision ());

    default_index::const_iterator begin = index_->cbegin (db_);
    default_index::const_iterator end = index_->cend (db_);
    EXPECT_NE (begin, end);
    std::string const & v1 = (*begin).first;
    EXPECT_EQ (first.first, v1);
    begin++;
    EXPECT_EQ (begin, end);
}